

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<3,_7,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  float scalar;
  Vector<float,_3> res;
  Type in0;
  float afStack_98 [6];
  float local_80 [6];
  float local_68 [4];
  Matrix<float,_4,_2> local_58;
  Matrix<float,_4,_2> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_58.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_58.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_58.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_58.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_58.m_data.m_data[0].m_data[0] = -0.6;
    local_58.m_data.m_data[0].m_data[1] = -0.6;
    local_58.m_data.m_data[0].m_data[2] = -0.2;
    local_58.m_data.m_data[0].m_data[3] = -0.1;
    local_58.m_data.m_data[1].m_data[0] = -1.1;
    local_58.m_data.m_data[1].m_data[1] = -0.6;
    local_58.m_data.m_data[1].m_data[2] = -0.6;
    local_58.m_data.m_data[1].m_data[3] = -0.1;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator/(&local_30,&local_58,scalar);
  local_80[0] = local_30.m_data.m_data[0].m_data[0];
  local_80[1] = local_30.m_data.m_data[0].m_data[1];
  local_80[2] = local_30.m_data.m_data[0].m_data[2];
  local_68[0] = local_30.m_data.m_data[1].m_data[1];
  local_68[1] = local_30.m_data.m_data[1].m_data[2];
  local_68[2] = local_30.m_data.m_data[1].m_data[3];
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar1 = 0;
  do {
    afStack_98[lVar1 + 2] = local_80[lVar1] + local_68[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_80[2] = 0.0;
  local_80[3] = 1.4013e-45;
  local_80[4] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_80[lVar1]] = afStack_98[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}